

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocator.cpp
# Opt level: O2

void __thiscall xscript::parser::register_allocator::release(register_allocator *this,int32_t r)

{
  int32_t local_c [2];
  int32_t r_local;
  
  local_c[0] = r;
  std::deque<int,_std::allocator<int>_>::push_back((deque<int,_std::allocator<int>_> *)this,local_c)
  ;
  return;
}

Assistant:

void register_allocator::release(int32_t r) {
    regs.push(r);
}